

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O0

void __thiscall DFraggleThinker::Destroy(DFraggleThinker *this)

{
  DRunningScript *pDVar1;
  DRunningScript *q_00;
  DFsScript *pDVar2;
  DRunningScript *q;
  DRunningScript *p;
  DFraggleThinker *this_local;
  
  q = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&this->RunningScripts);
  while (q != (DRunningScript *)0x0) {
    pDVar1 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&q->next);
    q_00 = TObjPtr<DRunningScript>::operator=(&q->next,(DRunningScript *)0x0);
    TObjPtr<DRunningScript>::operator=(&q->prev,q_00);
    (*(q->super_DObject)._vptr_DObject[4])();
    q = pDVar1;
  }
  TObjPtr<DRunningScript>::operator=(&this->RunningScripts,(DRunningScript *)0x0);
  pDVar2 = TObjPtr<DFsScript>::operator->(&this->LevelScript);
  (*(pDVar2->super_DObject)._vptr_DObject[4])();
  TObjPtr<DFsScript>::operator=(&this->LevelScript,(DFsScript *)0x0);
  TArray<TObjPtr<AActor>,_TObjPtr<AActor>_>::Clear(&this->SpawnedThings);
  TObjPtr<DFraggleThinker>::operator=(&ActiveThinker,(DFraggleThinker *)0x0);
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DFraggleThinker::Destroy()
{
	DRunningScript *p = RunningScripts;
	while (p)
	{
		DRunningScript *q = p;
		p = p->next;
		q->prev = q->next = NULL;
		q->Destroy();
	}
	RunningScripts = NULL;

	LevelScript->Destroy();
	LevelScript = NULL;

	SpawnedThings.Clear();
	ActiveThinker = NULL;
	Super::Destroy();
}